

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

CURLcode dict_do(connectdata *conn,_Bool *done)

{
  curl_socket_t sockfd;
  Curl_easy *data;
  int iVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  data = conn->data;
  sockfd = conn->sock[0];
  pcVar3 = (data->state).path;
  *done = true;
  iVar1 = Curl_raw_nequal(pcVar3,"/MATCH:",7);
  if (((iVar1 == 0) && (iVar1 = Curl_raw_nequal(pcVar3,"/M:",3), iVar1 == 0)) &&
     (iVar1 = Curl_raw_nequal(pcVar3,"/FIND:",6), iVar1 == 0)) {
    iVar1 = Curl_raw_nequal(pcVar3,"/DEFINE:",8);
    if (((iVar1 == 0) && (iVar1 = Curl_raw_nequal(pcVar3,"/D:",3), iVar1 == 0)) &&
       (iVar1 = Curl_raw_nequal(pcVar3,"/LOOKUP:",8), iVar1 == 0)) {
      pcVar3 = strchr(pcVar3,0x2f);
      if (pcVar3 == (char *)0x0) {
        return CURLE_OK;
      }
      do {
        while( true ) {
          pcVar3 = pcVar3 + 1;
          if (*pcVar3 != ':') break;
          *pcVar3 = ' ';
        }
      } while (*pcVar3 != '\0');
      CVar2 = Curl_sendf(sockfd,conn,"CLIENT libcurl 7.50.2-DEV\r\n%s\r\nQUIT\r\n");
      goto joined_r0x00127082;
    }
    pcVar3 = strchr(pcVar3,0x3a);
    if (pcVar3 == (char *)0x0) {
      pcVar4 = (char *)0x0;
LAB_00127156:
      Curl_infof(data,"lookup word is missing\n");
      pcVar3 = "default";
    }
    else {
      pcVar3 = pcVar3 + 1;
      pcVar6 = strchr(pcVar3,0x3a);
      if (pcVar6 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar4 = pcVar6 + 1;
        *pcVar6 = '\0';
        pcVar6 = strchr(pcVar4,0x3a);
        if (pcVar6 != (char *)0x0) {
          *pcVar6 = '\0';
        }
      }
      if (*pcVar3 == '\0') goto LAB_00127156;
    }
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
      pcVar4 = "!";
    }
    pcVar3 = unescape_word(data,pcVar3);
    if (pcVar3 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar2 = Curl_sendf(sockfd,conn,"CLIENT libcurl 7.50.2-DEV\r\nDEFINE %s %s\r\nQUIT\r\n",pcVar4,
                       pcVar3);
    (*Curl_cfree)(pcVar3);
    goto joined_r0x00127082;
  }
  pcVar3 = strchr(pcVar3,0x3a);
  if (pcVar3 == (char *)0x0) {
    pcVar4 = (char *)0x0;
    pcVar6 = (char *)0x0;
LAB_00126ff4:
    Curl_infof(data,"lookup word is missing\n");
    pcVar3 = "default";
  }
  else {
    pcVar3 = pcVar3 + 1;
    pcVar4 = strchr(pcVar3,0x3a);
    if (pcVar4 == (char *)0x0) {
      pcVar6 = (char *)0x0;
LAB_00126feb:
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar6 = pcVar4 + 1;
      *pcVar4 = '\0';
      pcVar5 = strchr(pcVar6,0x3a);
      if (pcVar5 == (char *)0x0) goto LAB_00126feb;
      pcVar4 = pcVar5 + 1;
      *pcVar5 = '\0';
      pcVar5 = strchr(pcVar4,0x3a);
      if (pcVar5 != (char *)0x0) {
        *pcVar5 = '\0';
      }
    }
    if (*pcVar3 == '\0') goto LAB_00126ff4;
  }
  if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
    pcVar6 = "!";
  }
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    pcVar4 = ".";
  }
  pcVar3 = unescape_word(data,pcVar3);
  if (pcVar3 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  CVar2 = Curl_sendf(sockfd,conn,"CLIENT libcurl 7.50.2-DEV\r\nMATCH %s %s %s\r\nQUIT\r\n",pcVar6,
                     pcVar4,pcVar3);
  (*Curl_cfree)(pcVar3);
joined_r0x00127082:
  if (CVar2 == CURLE_OK) {
    CVar2 = CURLE_OK;
    Curl_setup_transfer(conn,0,-1,false,&(data->req).bytecount,-1,(curl_off_t *)0x0);
  }
  else {
    Curl_failf(data,"Failed sending DICT request");
  }
  return CVar2;
}

Assistant:

static CURLcode dict_do(struct connectdata *conn, bool *done)
{
  char *word;
  char *eword;
  char *ppath;
  char *database = NULL;
  char *strategy = NULL;
  char *nthdef = NULL; /* This is not part of the protocol, but required
                          by RFC 2229 */
  CURLcode result=CURLE_OK;
  struct Curl_easy *data=conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];

  char *path = data->state.path;
  curl_off_t *bytecount = &data->req.bytecount;

  *done = TRUE; /* unconditionally */

  if(conn->bits.user_passwd) {
    /* AUTH is missing */
  }

  if(Curl_raw_nequal(path, DICT_MATCH, sizeof(DICT_MATCH)-1) ||
      Curl_raw_nequal(path, DICT_MATCH2, sizeof(DICT_MATCH2)-1) ||
      Curl_raw_nequal(path, DICT_MATCH3, sizeof(DICT_MATCH3)-1)) {

    word = strchr(path, ':');
    if(word) {
      word++;
      database = strchr(word, ':');
      if(database) {
        *database++ = (char)0;
        strategy = strchr(database, ':');
        if(strategy) {
          *strategy++ = (char)0;
          nthdef = strchr(strategy, ':');
          if(nthdef) {
            *nthdef = (char)0;
          }
        }
      }
    }

    if((word == NULL) || (*word == (char)0)) {
      infof(data, "lookup word is missing\n");
      word=(char *)"default";
    }
    if((database == NULL) || (*database == (char)0)) {
      database = (char *)"!";
    }
    if((strategy == NULL) || (*strategy == (char)0)) {
      strategy = (char *)".";
    }

    eword = unescape_word(data, word);
    if(!eword)
      return CURLE_OUT_OF_MEMORY;

    result = Curl_sendf(sockfd, conn,
                        "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                        "MATCH "
                        "%s "    /* database */
                        "%s "    /* strategy */
                        "%s\r\n" /* word */
                        "QUIT\r\n",

                        database,
                        strategy,
                        eword
                        );

    free(eword);

    if(result) {
      failf(data, "Failed sending DICT request");
      return result;
    }
    Curl_setup_transfer(conn, FIRSTSOCKET, -1, FALSE, bytecount,
                        -1, NULL); /* no upload */
  }
  else if(Curl_raw_nequal(path, DICT_DEFINE, sizeof(DICT_DEFINE)-1) ||
           Curl_raw_nequal(path, DICT_DEFINE2, sizeof(DICT_DEFINE2)-1) ||
           Curl_raw_nequal(path, DICT_DEFINE3, sizeof(DICT_DEFINE3)-1)) {

    word = strchr(path, ':');
    if(word) {
      word++;
      database = strchr(word, ':');
      if(database) {
        *database++ = (char)0;
        nthdef = strchr(database, ':');
        if(nthdef) {
          *nthdef = (char)0;
        }
      }
    }

    if((word == NULL) || (*word == (char)0)) {
      infof(data, "lookup word is missing\n");
      word=(char *)"default";
    }
    if((database == NULL) || (*database == (char)0)) {
      database = (char *)"!";
    }

    eword = unescape_word(data, word);
    if(!eword)
      return CURLE_OUT_OF_MEMORY;

    result = Curl_sendf(sockfd, conn,
                        "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                        "DEFINE "
                        "%s "     /* database */
                        "%s\r\n"  /* word */
                        "QUIT\r\n",
                        database,
                        eword);

    free(eword);

    if(result) {
      failf(data, "Failed sending DICT request");
      return result;
    }
    Curl_setup_transfer(conn, FIRSTSOCKET, -1, FALSE, bytecount,
                        -1, NULL); /* no upload */
  }
  else {

    ppath = strchr(path, '/');
    if(ppath) {
      int i;

      ppath++;
      for(i = 0; ppath[i]; i++) {
        if(ppath[i] == ':')
          ppath[i] = ' ';
      }
      result = Curl_sendf(sockfd, conn,
                          "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                          "%s\r\n"
                          "QUIT\r\n", ppath);
      if(result) {
        failf(data, "Failed sending DICT request");
        return result;
      }

      Curl_setup_transfer(conn, FIRSTSOCKET, -1, FALSE, bytecount, -1, NULL);
    }
  }

  return CURLE_OK;
}